

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O3

bool have_schar(char *arg)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  
  cVar1 = *arg;
  if (cVar1 == '\0') {
    return false;
  }
  pcVar3 = arg + 1;
  while ((((int)cVar1 - 0x30U < 10 || (iVar2 = isalpha((int)cVar1), cVar1 == ' ')) || (iVar2 != 0)))
  {
    cVar1 = *pcVar3;
    pcVar3 = pcVar3 + 1;
    if (cVar1 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

bool have_schar(char *arg)
{
	if (*arg == '\0')
		return false;

	for (; *arg != '\0'; arg++)
	{
		if (!isdigit(*arg) && !isalpha(*arg) && *arg != ' ')
			return true;
	}

	return false;
}